

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_quad_mesh.cpp
# Opt level: O2

void __thiscall embree::QuadMesh::QuadMesh(QuadMesh *this,Device *device)

{
  size_t *psVar1;
  undefined8 *puVar2;
  size_t *psVar3;
  Device *pDVar4;
  BufferView<embree::Vec3fa> *pBVar5;
  char *pcVar6;
  char *pcVar7;
  size_t sVar8;
  size_t sVar9;
  undefined8 uVar10;
  int iVar11;
  undefined4 extraout_var;
  ulong uVar12;
  long lVar13;
  size_t i;
  ulong uVar14;
  ulong uVar15;
  RawBufferView *this_00;
  
  Geometry::Geometry(&this->super_Geometry,device,GTY_QUAD_MESH,0,1);
  (this->super_Geometry).super_RefCount._vptr_RefCount = (_func_int **)&PTR__QuadMesh_021d5e50;
  *(undefined8 *)&(this->super_Geometry).field_0x58 = 0;
  *(undefined8 *)&this->field_0x60 = 0;
  *(undefined8 *)&this->field_0x68 = 0;
  *(undefined8 *)&this->field_0x70 = 0;
  *(undefined8 *)&this->field_0x78 = 0x100000000;
  this->field_0x80 = 1;
  *(undefined8 *)&this->field_0x84 = 0;
  *(undefined8 *)&this->field_0x8c = 0;
  *(undefined8 *)((long)&(this->vertices0).super_RawBufferView.ptr_ofs + 4) = 0;
  *(undefined8 *)((long)&(this->vertices0).super_RawBufferView.dptr_ofs + 4) = 0;
  *(undefined8 *)((long)&(this->vertices0).super_RawBufferView.stride + 4) = 0;
  *(undefined8 *)((long)&(this->vertices0).super_RawBufferView.num + 4) = 0;
  (this->vertices0).super_RawBufferView.modCounter = 1;
  (this->vertices0).super_RawBufferView.modified = true;
  (this->vertices0).super_RawBufferView.userData = 0;
  (this->vertices0).super_RawBufferView.buffer.ptr = (Buffer *)0x0;
  pDVar4 = (this->super_Geometry).device;
  (this->vertices).alloc.device = pDVar4;
  (this->vertices).size_active = 0;
  (this->vertices).size_alloced = 0;
  (this->vertices).items = (BufferView<embree::Vec3fa> *)0x0;
  (this->vertexAttribs).alloc.device = pDVar4;
  (this->vertexAttribs).items = (RawBufferView *)0x0;
  psVar1 = &(this->vertices).size_active;
  (this->vertexAttribs).size_active = 0;
  (this->vertexAttribs).size_alloced = 0;
  uVar15 = (ulong)(this->super_Geometry).numTimeSteps;
  if (uVar15 == 0) {
    *psVar1 = 0;
  }
  else {
    iVar11 = (*(pDVar4->super_State).super_RefCount._vptr_RefCount[8])(pDVar4,uVar15 * 0x38,8,3);
    (this->vertices).items = (BufferView<embree::Vec3fa> *)CONCAT44(extraout_var,iVar11);
    this_00 = (RawBufferView *)0x0;
    for (uVar14 = 0; uVar12 = *psVar1, uVar14 < uVar12; uVar14 = uVar14 + 1) {
      pBVar5 = (this->vertices).items;
      pcVar6 = this_00->ptr_ofs;
      pcVar7 = this_00->dptr_ofs;
      sVar8 = this_00->stride;
      sVar9 = this_00->num;
      uVar10 = *(undefined8 *)&this_00->modified;
      puVar2 = (undefined8 *)((long)&(pBVar5->super_RawBufferView).format + (long)this_00);
      *puVar2 = *(undefined8 *)&this_00->format;
      puVar2[1] = uVar10;
      psVar3 = (size_t *)((long)&(pBVar5->super_RawBufferView).stride + (long)this_00);
      *psVar3 = sVar8;
      psVar3[1] = sVar9;
      puVar2 = (undefined8 *)((long)&this_00->ptr_ofs + (long)&pBVar5->super_RawBufferView);
      *puVar2 = pcVar6;
      puVar2[1] = pcVar7;
      *(Buffer **)((long)&this_00->ptr_ofs + (long)&(pBVar5->super_RawBufferView).buffer.ptr) =
           (this_00->buffer).ptr;
      (this_00->buffer).ptr = (Buffer *)0x0;
      RawBufferView::~RawBufferView(this_00);
      this_00 = this_00 + 1;
    }
    lVar13 = uVar12 * 0x38 + 0x30;
    for (; uVar12 < uVar15; uVar12 = uVar12 + 1) {
      pBVar5 = (this->vertices).items;
      puVar2 = (undefined8 *)((long)pBVar5 + lVar13 + -0x20);
      *puVar2 = 0;
      puVar2[1] = 0;
      puVar2 = (undefined8 *)((long)pBVar5 + lVar13 + -0x30);
      *puVar2 = 0;
      puVar2[1] = 0;
      *(undefined8 *)((long)pBVar5 + lVar13 + -0x10) = 0x100000000;
      *(undefined1 *)((long)pBVar5 + lVar13 + -8) = 1;
      *(undefined4 *)((long)pBVar5 + lVar13 + -4) = 0;
      *(undefined8 *)((long)&(pBVar5->super_RawBufferView).ptr_ofs + lVar13) = 0;
      lVar13 = lVar13 + 0x38;
    }
    pDVar4 = (this->vertices).alloc.device;
    if (pDVar4 != (Device *)0x0) {
      (*(pDVar4->super_State).super_RefCount._vptr_RefCount[9])(pDVar4,0);
    }
    (this->vertices).size_active = uVar15;
    (this->vertices).size_alloced = uVar15;
  }
  return;
}

Assistant:

QuadMesh::QuadMesh (Device* device)
    : Geometry(device,GTY_QUAD_MESH,0,1)
  {
    vertices.resize(numTimeSteps);
  }